

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void chatra::structureInnerNode
               (IErrorReceiver *errorReceiver,shared_ptr<chatra::StringTable> *sTable,Node *node,
               bool recursive)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  NodeType NVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  _Var2;
  StringId SVar3;
  bool bVar4;
  bool bVar5;
  element_type *peVar6;
  reference pvVar7;
  Token *token;
  Token *token_00;
  size_type sVar8;
  pointer ppVar9;
  size_type sVar10;
  reference ppTVar11;
  __shared_ptr_access<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  reference __x;
  size_type sVar12;
  const_iterator cVar13;
  element_type *peVar14;
  __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var15;
  __shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *this_02;
  element_type *peVar16;
  string *local_728;
  uint local_6fc;
  shared_ptr<chatra::Node> *n_5;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *__range2_1
  ;
  pointer pbStack_6d0;
  pointer local_6c8;
  allocator local_6b1;
  string local_6b0;
  __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_690;
  value_type *nGroup_1;
  pointer pbStack_680;
  pointer local_678;
  allocator local_661;
  string local_660;
  shared_ptr<chatra::Line> local_640;
  __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_630;
  shared_ptr<chatra::Node> *nGroup;
  shared_ptr<chatra::Node> *n_4;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5e8;
  allocator local_5c9;
  string local_5c8;
  __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_5a8;
  shared_ptr<chatra::Node> *n_3;
  __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  local_598;
  const_iterator it_2;
  bool defaultFound;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_568;
  allocator local_541;
  string local_540;
  shared_ptr<chatra::Node> *local_520;
  __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  local_518 [2];
  shared_ptr<chatra::Node> *local_508;
  shared_ptr<chatra::Node> *local_500;
  shared_ptr<chatra::Node> *local_4f8;
  const_iterator local_4f0;
  __normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  local_4e8;
  shared_ptr<chatra::Node> *local_4e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4d8;
  allocator local_4b1;
  string local_4b0;
  shared_ptr<chatra::Node> *local_490;
  shared_ptr<chatra::Node> *local_488;
  const_iterator local_480;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_478;
  allocator local_459;
  string local_458;
  __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_438;
  shared_ptr<chatra::Node> *n_2;
  __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  local_428;
  const_iterator it_1;
  undefined1 auStack_418 [5];
  bool left;
  bool finallyFound;
  bool catchFinallyFound;
  pointer pbStack_410;
  pointer local_408;
  allocator local_3f1;
  string local_3f0;
  __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_3d0;
  shared_ptr<chatra::Node> *n_1;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *__range2;
  undefined1 auStack_3a8 [7];
  bool runnableNodeFound;
  pointer pbStack_3a0;
  pointer local_398;
  allocator local_381;
  string local_380;
  __normal_iterator<const_chatra::NodeType_*,_std::vector<chatra::NodeType,_std::allocator<chatra::NodeType>_>_>
  local_360;
  NodeType *local_358;
  __normal_iterator<const_chatra::NodeType_*,_std::vector<chatra::NodeType,_std::allocator<chatra::NodeType>_>_>
  local_350;
  __normal_iterator<const_chatra::NodeType_*,_std::vector<chatra::NodeType,_std::allocator<chatra::NodeType>_>_>
  local_348;
  shared_ptr<chatra::Node> *local_340;
  __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  local_338;
  shared_ptr<chatra::Node> *local_330;
  shared_ptr<chatra::Node> *local_328;
  __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  local_320;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  string local_300;
  allocator local_2d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  __normal_iterator<const_chatra::NodeType_*,_std::vector<chatra::NodeType,_std::allocator<chatra::NodeType>_>_>
  local_278;
  NodeType *local_270;
  __normal_iterator<const_chatra::NodeType_*,_std::vector<chatra::NodeType,_std::allocator<chatra::NodeType>_>_>
  local_268;
  __normal_iterator<const_chatra::NodeType_*,_std::vector<chatra::NodeType,_std::allocator<chatra::NodeType>_>_>
  local_260;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  allocator local_239;
  string local_238;
  __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  local_218;
  shared_ptr<chatra::Node> *local_210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  allocator local_1e1;
  string local_1e0;
  shared_ptr<chatra::Node> *local_1c0;
  __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  local_1b8;
  shared_ptr<chatra::Node> *local_1b0;
  LineAttributes *local_1a8;
  LineAttributes *attr;
  _Node_iterator_base<std::pair<const_chatra::StringId,_chatra::LineAttributes>,_false> local_198;
  iterator itType;
  Token *pTStack_188;
  StringId labelName;
  Token *keyToken;
  Token *token2;
  Token *token1;
  Token *token0;
  size_t tokenIndex;
  const_iterator itForward;
  string local_118;
  string local_f8;
  iterator local_d8;
  size_type local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  allocator local_99;
  string local_98;
  __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_78;
  shared_ptr<chatra::Node> *n;
  __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  local_68;
  const_iterator it;
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> outNodes;
  undefined1 local_40 [4];
  uint expectedIndents;
  ParserContext ct;
  bool recursive_local;
  Node *node_local;
  shared_ptr<chatra::StringTable> *sTable_local;
  IErrorReceiver *errorReceiver_local;
  
  ct.sTable._7_1_ = recursive;
  ParserContext::ParserContext
            ((ParserContext *)local_40,(ParserWorkingSet *)0x0,errorReceiver,sTable);
  bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&node->line);
  if (bVar4) {
    peVar6 = std::__shared_ptr_access<chatra::Line,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chatra::Line,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&node->line);
    local_6fc = peVar6->indents + 1;
  }
  else {
    local_6fc = 0;
  }
  std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
  vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *)
         &it);
  local_68._M_current =
       (shared_ptr<chatra::Node> *)
       std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
       cbegin(&node->blockNodes);
LAB_0027076e:
  n = (shared_ptr<chatra::Node> *)
      std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
      cend(&node->blockNodes);
  bVar4 = __gnu_cxx::operator!=
                    (&local_68,
                     (__normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                      *)&n);
  if (bVar4) {
    local_78 = (__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
               ::operator*(&local_68);
    peVar14 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(local_78);
    peVar6 = std::__shared_ptr_access<chatra::Line,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chatra::Line,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&peVar14->line);
    if (peVar6->indents == local_6fc) {
      peVar14 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(local_78);
      peVar6 = std::__shared_ptr_access<chatra::Line,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<chatra::Line,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar14->line);
      pvVar7 = std::vector<chatra::Token,_std::allocator<chatra::Token>_>::operator[]
                         (&peVar6->tokens,0);
      _Var2._M_current = local_68._M_current;
      if (pvVar7->type == Name) {
        tokenIndex = (size_t)local_68._M_current;
        token0 = (Token *)0x0;
        cVar13 = std::
                 vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 ::cend(&node->blockNodes);
        pTStack_188 = nextTokenFromNodes<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                                (_Var2,(__normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                                        )cVar13._M_current,
                                 (__normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                                  *)&tokenIndex,(size_t *)&token0);
        _Var2._M_current = local_68._M_current;
        cVar13 = std::
                 vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 ::cend(&node->blockNodes);
        token = nextTokenFromNodes<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                          (_Var2,(__normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                                  )cVar13._M_current,
                           (__normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                            *)&tokenIndex,(size_t *)&token0);
        _Var2._M_current = local_68._M_current;
        cVar13 = std::
                 vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 ::cend(&node->blockNodes);
        token_00 = nextTokenFromNodes<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                             (_Var2,(__normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                                     )cVar13._M_current,
                              (__normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                               *)&tokenIndex,(size_t *)&token0);
        itType.
        super__Node_iterator_base<std::pair<const_chatra::StringId,_chatra::LineAttributes>,_false>.
        _M_cur._4_4_ = Invalid;
        if ((((token_00 != (Token *)0x0) &&
             (sVar8 = std::
                      unordered_map<chatra::StringId,_chatra::LineAttributes,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::LineAttributes>_>_>
                      ::count((unordered_map<chatra::StringId,_chatra::LineAttributes,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::LineAttributes>_>_>
                               *)lineTypes,&pTStack_188->sid), sVar8 == 0)) &&
            (bVar4 = matches(token,Colon), bVar4)) && (bVar4 = matches(token_00,Name), bVar4)) {
          itType.
          super__Node_iterator_base<std::pair<const_chatra::StringId,_chatra::LineAttributes>,_false>
          ._M_cur._4_4_ = pTStack_188->sid;
          pTStack_188 = token_00;
        }
        local_198._M_cur =
             (__node_type *)
             std::
             unordered_map<chatra::StringId,_chatra::LineAttributes,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::LineAttributes>_>_>
             ::find((unordered_map<chatra::StringId,_chatra::LineAttributes,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::LineAttributes>_>_>
                     *)lineTypes,&pTStack_188->sid);
        attr = (LineAttributes *)
               std::
               unordered_map<chatra::StringId,_chatra::LineAttributes,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::LineAttributes>_>_>
               ::end((unordered_map<chatra::StringId,_chatra::LineAttributes,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::LineAttributes>_>_>
                      *)lineTypes);
        bVar4 = std::__detail::operator!=
                          (&local_198,
                           (_Node_iterator_base<std::pair<const_chatra::StringId,_chatra::LineAttributes>,_false>
                            *)&attr);
        if (bVar4) {
          ppVar9 = std::__detail::
                   _Node_iterator<std::pair<const_chatra::StringId,_chatra::LineAttributes>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_chatra::StringId,_chatra::LineAttributes>,_false,_false>
                                 *)&local_198);
          local_1a8 = &ppVar9->second;
          local_1b8._M_current = local_68._M_current;
          local_1c0 = (shared_ptr<chatra::Node> *)
                      std::
                      vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                      ::cend(&node->blockNodes);
          local_1b0 = (shared_ptr<chatra::Node> *)
                      combineWrappedLines<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                                (local_1b8,
                                 (__normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                                  )local_1c0,(bool)(local_1a8->hasBlock & 1));
          local_68 = (__normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                      )local_1b0;
          if ((token_00 != (Token *)0x0) &&
             (itType.
              super__Node_iterator_base<std::pair<const_chatra::StringId,_chatra::LineAttributes>,_false>
              ._M_cur._4_4_ != Invalid)) {
            peVar14 = std::
                      __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->(local_78);
            sVar10 = std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>::
                     size(&peVar14->tokens);
            if (2 < sVar10) {
              peVar14 = std::
                        __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->(local_78);
              ppTVar11 = std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                         ::operator[](&peVar14->tokens,2);
              SVar3 = itType.
                      super__Node_iterator_base<std::pair<const_chatra::StringId,_chatra::LineAttributes>,_false>
                      ._M_cur._4_4_;
              if (token_00 == *ppTVar11) {
                if ((local_1a8->type == For) || (local_1a8->type == While)) {
                  peVar14 = std::
                            __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->(local_78);
                  peVar14->sid = SVar3;
                  goto LAB_002710a0;
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_238,"only \"for\" or \"while\" can take label",
                           &local_239);
                local_258.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_258.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_258.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_258);
                ParserContext::errorAtToken
                          ((ParserContext *)local_40,Error,token_00,&local_238,&local_258);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_258);
                std::__cxx11::string::~string((string *)&local_238);
                std::allocator<char>::~allocator((allocator<char> *)&local_239);
                goto LAB_0027076e;
              }
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_1e0,
                       "this line seems to be part of wrapping line, but indents may be incorrect",
                       &local_1e1);
            local_208.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_208.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_208.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_208);
            ParserContext::errorAtToken
                      ((ParserContext *)local_40,Error,token_00,&local_1e0,&local_208);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_208);
            std::__cxx11::string::~string((string *)&local_1e0);
            std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
            local_218._M_current =
                 (shared_ptr<chatra::Node> *)
                 std::
                 vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 ::cend(&node->blockNodes);
            bVar4 = __gnu_cxx::operator==
                              ((__normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                                *)&tokenIndex,&local_218);
            if ((bVar4) || (token0 == (Token *)0x0)) {
              local_210 = (shared_ptr<chatra::Node> *)tokenIndex;
            }
            else {
              local_210 = (shared_ptr<chatra::Node> *)
                          __gnu_cxx::
                          __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                          ::operator+((__normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                                       *)&tokenIndex,1);
            }
            local_68._M_current = local_210;
            goto LAB_0027076e;
          }
LAB_002710a0:
          local_268._M_current =
               (NodeType *)
               std::vector<chatra::NodeType,_std::allocator<chatra::NodeType>_>::cbegin
                         (&local_1a8->parentType);
          local_270 = (NodeType *)
                      std::vector<chatra::NodeType,_std::allocator<chatra::NodeType>_>::cend
                                (&local_1a8->parentType);
          local_260 = std::
                      find<__gnu_cxx::__normal_iterator<chatra::NodeType_const*,std::vector<chatra::NodeType,std::allocator<chatra::NodeType>>>,chatra::NodeType>
                                (local_268,
                                 (__normal_iterator<const_chatra::NodeType_*,_std::vector<chatra::NodeType,_std::allocator<chatra::NodeType>_>_>
                                  )local_270,&node->type);
          local_278._M_current =
               (NodeType *)
               std::vector<chatra::NodeType,_std::allocator<chatra::NodeType>_>::cend
                         (&local_1a8->parentType);
          bVar4 = __gnu_cxx::operator==(&local_260,&local_278);
          if (bVar4) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_2d8,"statement \"",&local_2d9);
            this_00 = (__shared_ptr_access<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)ParserContext::getSt((ParserContext *)local_40);
            this_01 = std::
                      __shared_ptr_access<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->(this_00);
            StringTable::ref_abi_cxx11_(&local_300,this_01,pTStack_188->sid);
            std::operator+(&local_2b8,&local_2d8,&local_300);
            std::operator+(&local_298,&local_2b8,"\" is not allowed here");
            local_318.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_318.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_318.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_318);
            ParserContext::errorAtToken
                      ((ParserContext *)local_40,Error,pTStack_188,&local_298,&local_318);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_318);
            std::__cxx11::string::~string((string *)&local_298);
            std::__cxx11::string::~string((string *)&local_2b8);
            std::__cxx11::string::~string((string *)&local_300);
            std::__cxx11::string::~string((string *)&local_2d8);
            std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
          }
          else {
            NVar1 = local_1a8->type;
            peVar14 = std::
                      __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->(local_78);
            peVar14->type = NVar1;
            peVar14 = std::
                      __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->(local_78);
            if (((peVar14->type == Def) && (token != (Token *)0x0)) &&
               (bVar4 = matches(token,Operator), bVar4)) {
              peVar14 = std::
                        __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->(local_78);
              peVar14->type = DefOperator;
            }
            peVar14 = std::
                      __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->(local_78);
            if (((peVar14->type == Else) && (token != (Token *)0x0)) &&
               (bVar4 = matches(token,If), bVar4)) {
              peVar14 = std::
                        __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->(local_78);
              peVar14->type = ElseIf;
            }
            if ((local_1a8->hasBlock & 1U) != 0) {
              while( true ) {
                local_320._M_current =
                     (shared_ptr<chatra::Node> *)
                     std::
                     vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     ::cend(&node->blockNodes);
                bVar5 = __gnu_cxx::operator!=(&local_68,&local_320);
                bVar4 = false;
                if (bVar5) {
                  p_Var15 = (__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)__gnu_cxx::
                               __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                               ::operator*(&local_68);
                  peVar14 = std::
                            __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->(p_Var15);
                  peVar6 = std::
                           __shared_ptr_access<chatra::Line,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<chatra::Line,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)&peVar14->line);
                  bVar4 = local_6fc < peVar6->indents;
                }
                if (!bVar4) break;
                peVar14 = std::
                          __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->(local_78);
                __x = __gnu_cxx::
                      __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                      ::operator*(&local_68);
                std::
                vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                ::push_back(&peVar14->blockNodes,__x);
                local_328 = (shared_ptr<chatra::Node> *)
                            __gnu_cxx::
                            __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                            ::operator++(&local_68,0);
              }
            }
            std::
            vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
            push_back((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                       *)&it,(value_type *)local_78);
          }
          goto LAB_0027076e;
        }
      }
      local_338._M_current = local_68._M_current;
      local_340 = (shared_ptr<chatra::Node> *)
                  std::
                  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                  ::cend(&node->blockNodes);
      local_330 = (shared_ptr<chatra::Node> *)
                  combineWrappedLines<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                            (local_338,
                             (__normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                              )local_340,false);
      local_68 = (__normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                  )local_330;
      local_350._M_current =
           (NodeType *)
           std::vector<chatra::NodeType,_std::allocator<chatra::NodeType>_>::cbegin
                     ((vector<chatra::NodeType,_std::allocator<chatra::NodeType>_> *)
                      expressionParentType);
      local_358 = (NodeType *)
                  std::vector<chatra::NodeType,_std::allocator<chatra::NodeType>_>::cend
                            ((vector<chatra::NodeType,_std::allocator<chatra::NodeType>_> *)
                             expressionParentType);
      local_348 = std::
                  find<__gnu_cxx::__normal_iterator<chatra::NodeType_const*,std::vector<chatra::NodeType,std::allocator<chatra::NodeType>>>,chatra::NodeType>
                            (local_350,
                             (__normal_iterator<const_chatra::NodeType_*,_std::vector<chatra::NodeType,_std::allocator<chatra::NodeType>_>_>
                              )local_358,&node->type);
      local_360._M_current =
           (NodeType *)
           std::vector<chatra::NodeType,_std::allocator<chatra::NodeType>_>::cend
                     ((vector<chatra::NodeType,_std::allocator<chatra::NodeType>_> *)
                      expressionParentType);
      bVar4 = __gnu_cxx::operator==(&local_348,&local_360);
      if (bVar4) {
        peVar14 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(local_78);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_380,"expression is not allowed here",&local_381);
        _auStack_3a8 = (pointer)0x0;
        pbStack_3a0 = (pointer)0x0;
        local_398 = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)auStack_3a8);
        ParserContext::errorAtLine
                  ((ParserContext *)local_40,Error,&peVar14->line,&local_380,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)auStack_3a8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_3a8);
        std::__cxx11::string::~string((string *)&local_380);
        std::allocator<char>::~allocator((allocator<char> *)&local_381);
      }
      else {
        peVar14 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(local_78);
        peVar14->type = Expression;
        std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
        ::push_back((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     *)&it,(value_type *)local_78);
      }
      goto LAB_0027076e;
    }
    peVar14 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(local_78);
    peVar6 = std::__shared_ptr_access<chatra::Line,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chatra::Line,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&peVar14->line);
    pvVar7 = std::vector<chatra::Token,_std::allocator<chatra::Token>_>::operator[]
                       (&peVar6->tokens,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_98,"indent mismatch. Expected ${0} indents but ${1} indents found",
               &local_99);
    std::__cxx11::to_string(&local_118,local_6fc);
    peVar14 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(local_78);
    peVar6 = std::__shared_ptr_access<chatra::Line,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chatra::Line,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&peVar14->line);
    std::__cxx11::to_string(&local_f8,peVar6->indents);
    local_d8 = &local_118;
    local_d0 = 2;
    this = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&itForward._M_current + 7);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(this);
    __l._M_len = local_d0;
    __l._M_array = local_d8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_c8,__l,this);
    ParserContext::errorAtToken((ParserContext *)local_40,Error,pvVar7,&local_98,&local_c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&itForward._M_current + 7));
    local_728 = (string *)&local_d8;
    do {
      local_728 = local_728 + -1;
      std::__cxx11::string::~string((string *)local_728);
    } while (local_728 != &local_118);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
    clear((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *)
          &it);
  }
  sVar12 = std::
           unordered_set<chatra::NodeType,_std::hash<chatra::NodeType>,_std::equal_to<chatra::NodeType>,_std::allocator<chatra::NodeType>_>
           ::count((unordered_set<chatra::NodeType,_std::hash<chatra::NodeType>,_std::equal_to<chatra::NodeType>,_std::allocator<chatra::NodeType>_>
                    *)runnableContainerNodeTypes,&node->type);
  if (sVar12 != 0) {
    bVar4 = false;
    __end2 = std::
             vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
             ::begin((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                      *)&it);
    n_1 = (shared_ptr<chatra::Node> *)
          std::
          vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
          end((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               *)&it);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                                       *)&n_1), bVar5) {
      local_3d0 = (__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  __gnu_cxx::
                  __normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                  ::operator*(&__end2);
      peVar14 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(local_3d0);
      sVar12 = std::
               unordered_set<chatra::NodeType,_std::hash<chatra::NodeType>,_std::equal_to<chatra::NodeType>,_std::allocator<chatra::NodeType>_>
               ::count((unordered_set<chatra::NodeType,_std::hash<chatra::NodeType>,_std::equal_to<chatra::NodeType>,_std::allocator<chatra::NodeType>_>
                        *)runnableNodeTypes,&peVar14->type);
      if (sVar12 != 0) {
        bVar4 = true;
        break;
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
      ::operator++(&__end2);
    }
    if (!bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3f0,"empty block statement",&local_3f1);
      _auStack_418 = (pointer)0x0;
      pbStack_410 = (pointer)0x0;
      local_408 = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)auStack_418);
      ParserContext::errorAtLine
                ((ParserContext *)local_40,Warning,&node->line,&local_3f0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)auStack_418);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_418);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
    }
  }
  it_1._M_current._7_1_ = 0;
  it_1._M_current._6_1_ = 0;
  it_1._M_current._5_1_ = 0;
  local_428._M_current =
       (shared_ptr<chatra::Node> *)
       std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
       cbegin((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               *)&it);
  do {
    n_2 = (shared_ptr<chatra::Node> *)
          std::
          vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
          cend((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                *)&it);
    bVar4 = __gnu_cxx::operator!=
                      (&local_428,
                       (__normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                        *)&n_2);
    if (!bVar4) {
LAB_00271e77:
      if (node->type == Switch) {
        it_2._M_current._7_1_ = 0;
        local_598._M_current =
             (shared_ptr<chatra::Node> *)
             std::
             vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
             ::cbegin((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                       *)&it);
        while( true ) {
          n_3 = (shared_ptr<chatra::Node> *)
                std::
                vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                ::cend((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                        *)&it);
          bVar4 = __gnu_cxx::operator!=
                            (&local_598,
                             (__normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                              *)&n_3);
          if (!bVar4) break;
          local_5a8 = (__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )__gnu_cxx::
                       __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                       ::operator*(&local_598);
          peVar14 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(local_5a8);
          if (peVar14->type == Default) {
            it_2._M_current._7_1_ = 1;
          }
          else {
            peVar14 = std::
                      __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->(local_5a8);
            if ((peVar14->type == Case) && ((it_2._M_current._7_1_ & 1) != 0)) {
              peVar14 = std::
                        __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->(local_5a8);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_5c8,"\"case\" cannot be placed after \"default\"",
                         &local_5c9);
              local_5e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_5e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_5e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_5e8);
              ParserContext::errorAtLine
                        ((ParserContext *)local_40,Error,&peVar14->line,&local_5c8,&local_5e8);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_5e8);
              std::__cxx11::string::~string((string *)&local_5c8);
              std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
              _Var2._M_current = (shared_ptr<chatra::Node> *)local_598;
              cVar13 = std::
                       vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                       ::cend((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                               *)&it);
              std::
              vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ::erase((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                       *)&it,(const_iterator)_Var2._M_current,cVar13);
              break;
            }
          }
          __gnu_cxx::
          __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
          ::operator++(&local_598,0);
        }
      }
      std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
      clear(&node->blockNodes);
      __end1 = std::
               vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               ::begin((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                        *)&it);
      n_4 = (shared_ptr<chatra::Node> *)
            std::
            vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
            end((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 *)&it);
      do {
        bVar4 = __gnu_cxx::operator!=
                          (&__end1,(__normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                                    *)&n_4);
        if (!bVar4) {
          if ((ct.sTable._7_1_ & 1) != 0) {
            __end2_1 = std::
                       vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                       ::begin(&node->blockNodes);
            n_5 = (shared_ptr<chatra::Node> *)
                  std::
                  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                  ::end(&node->blockNodes);
            while (bVar4 = __gnu_cxx::operator!=
                                     (&__end2_1,
                                      (__normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                                       *)&n_5), bVar4) {
              this_02 = &__gnu_cxx::
                         __normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                         ::operator*(&__end2_1)->
                         super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
              peVar16 = std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::get(this_02);
              recursiveStructureNodes(errorReceiver,sTable,peVar16);
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
              ::operator++(&__end2_1);
            }
          }
          std::atomic<chatra::NodeState>::operator=(&node->blockNodesState,Structured);
          std::
          vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
          ~vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   *)&it);
          return;
        }
        nGroup = __gnu_cxx::
                 __normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                 ::operator*(&__end1);
        peVar14 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)nGroup);
        NVar1 = peVar14->type;
        if (NVar1 == Sync) {
          if ((ct.sTable._7_1_ & 1) == 0) {
            peVar16 = std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::get
                                (&nGroup->
                                  super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>);
            structureInnerNode(errorReceiver,sTable,peVar16,false);
          }
          std::
          vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
          push_back(&node->blockNodes,nGroup);
        }
        else if (NVar1 == If) {
          std::shared_ptr<chatra::Line>::shared_ptr(&local_640,(nullptr_t)0x0);
          p_Var15 = (__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    addNode<std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                              (&node->blockNodes,&local_640,IfGroup);
          std::shared_ptr<chatra::Line>::~shared_ptr(&local_640);
          local_630 = p_Var15;
          peVar14 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(p_Var15);
          std::
          vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
          push_back(&peVar14->blockNodes,nGroup);
          peVar14 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(local_630);
          std::atomic<chatra::NodeState>::operator=(&peVar14->blockNodesState,Structured);
        }
        else if ((byte)(NVar1 - ElseIf) < 2) {
          bVar4 = std::
                  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                  ::empty(&node->blockNodes);
          if (!bVar4) {
            p_Var15 = (__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )std::
                       vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                       ::back(&node->blockNodes);
            peVar14 = std::
                      __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->(p_Var15);
            if (peVar14->type == IfGroup) {
              local_690 = (__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)std::
                             vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                             ::back(&node->blockNodes);
              peVar14 = std::
                        __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->(local_690);
              p_Var15 = (__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)std::
                           vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                           ::back(&peVar14->blockNodes);
              peVar14 = std::
                        __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->(p_Var15);
              if (peVar14->type == Else) {
                peVar14 = std::
                          __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)nGroup);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_6b0,"extra \"else\" statement",&local_6b1);
                __range2_1 = (vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                              *)0x0;
                pbStack_6d0 = (pointer)0x0;
                local_6c8 = (pointer)0x0;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range2_1);
                ParserContext::errorAtLine
                          ((ParserContext *)local_40,Error,&peVar14->line,&local_6b0,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__range2_1);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&__range2_1);
                std::__cxx11::string::~string((string *)&local_6b0);
                std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
              }
              else {
                peVar14 = std::
                          __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->(local_690);
                std::
                vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                ::push_back(&peVar14->blockNodes,nGroup);
              }
              goto LAB_00272524;
            }
          }
          peVar14 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)nGroup);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_660,"unexpected \"else\" statement",&local_661);
          nGroup_1 = (value_type *)0x0;
          pbStack_680 = (pointer)0x0;
          local_678 = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&nGroup_1);
          ParserContext::errorAtLine
                    ((ParserContext *)local_40,Error,&peVar14->line,&local_660,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&nGroup_1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&nGroup_1);
          std::__cxx11::string::~string((string *)&local_660);
          std::allocator<char>::~allocator((allocator<char> *)&local_661);
        }
        else {
          std::
          vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
          push_back(&node->blockNodes,nGroup);
        }
LAB_00272524:
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
        ::operator++(&__end1);
      } while( true );
    }
    local_438 = (__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                __gnu_cxx::
                __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                ::operator*(&local_428);
    if ((it_1._M_current._6_1_ & 1) != 0) {
      peVar14 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(local_438);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_458,"nothing can be placed after \"finally\" block",&local_459);
      local_478.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_478.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_478.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_478);
      ParserContext::errorAtLine
                ((ParserContext *)local_40,Error,&peVar14->line,&local_458,&local_478);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_478);
      std::__cxx11::string::~string((string *)&local_458);
      std::allocator<char>::~allocator((allocator<char> *)&local_459);
      local_480._M_current = local_428._M_current;
      local_488 = (shared_ptr<chatra::Node> *)
                  std::
                  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                  ::cend((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                          *)&it);
      local_490 = (shared_ptr<chatra::Node> *)
                  std::
                  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                  ::erase((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                           *)&it,local_480,(const_iterator)local_488);
      goto LAB_00271e77;
    }
    peVar14 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(local_438);
    if (peVar14->type == Catch) {
      it_1._M_current._7_1_ = 1;
    }
    else {
      peVar14 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(local_438);
      if (peVar14->type == Finally) {
        it_1._M_current._7_1_ = 1;
        it_1._M_current._6_1_ = 1;
      }
      else if ((it_1._M_current._5_1_ & 1) == 0) {
        peVar14 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(local_438);
        if ((byte)(peVar14->type - Break) < 4) {
          it_1._M_current._5_1_ = 1;
        }
        if ((it_1._M_current._7_1_ & 1) != 0) {
          peVar14 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(local_438);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_540,"expected \"catch\" or \"finally\"",&local_541);
          local_568.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_568.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_568.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_568);
          ParserContext::errorAtLine
                    ((ParserContext *)local_40,Error,&peVar14->line,&local_540,&local_568);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_568);
          std::__cxx11::string::~string((string *)&local_540);
          std::allocator<char>::~allocator((allocator<char> *)&local_541);
          _Var2._M_current = (shared_ptr<chatra::Node> *)local_428;
          cVar13 = std::
                   vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ::cend((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                           *)&it);
          std::
          vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
          erase((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 *)&it,(const_iterator)_Var2._M_current,cVar13);
          goto LAB_00271e77;
        }
      }
      else {
        peVar14 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(local_438);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_4b0,"unreachable code",&local_4b1);
        local_4d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_4d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_4d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_4d8);
        ParserContext::errorAtLine
                  ((ParserContext *)local_40,Warning,&peVar14->line,&local_4b0,&local_4d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_4d8);
        std::__cxx11::string::~string((string *)&local_4b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
        local_4f0._M_current = local_428._M_current;
        local_500 = local_428._M_current;
        local_508 = (shared_ptr<chatra::Node> *)
                    std::
                    vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                    ::cend((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                            *)&it);
        local_4f8 = (shared_ptr<chatra::Node> *)
                    std::
                    find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,chatra::structureInnerNode(chatra::IErrorReceiver&,std::shared_ptr<chatra::StringTable>&,chatra::Node*,bool)::__0>
                              (local_500,local_508);
        local_4e8._M_current =
             (shared_ptr<chatra::Node> *)
             std::
             vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
             ::erase((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                      *)&it,local_4f0,(const_iterator)local_4f8);
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
        ::__normal_iterator<std::shared_ptr<chatra::Node>*>
                  ((__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                    *)&local_4e0,&local_4e8);
        local_428._M_current = local_4e0;
        local_518[0]._M_current =
             (shared_ptr<chatra::Node> *)
             std::
             vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
             ::cend((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     *)&it);
        bVar4 = __gnu_cxx::operator==(&local_428,local_518);
        if (bVar4) goto LAB_00271e77;
        local_520 = (shared_ptr<chatra::Node> *)
                    __gnu_cxx::
                    __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                    ::operator--(&local_428,0);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
    ::operator++(&local_428,0);
  } while( true );
}

Assistant:

void structureInnerNode(IErrorReceiver& errorReceiver,
		std::shared_ptr<StringTable>& sTable, Node* node, bool recursive) {

	chatra_assert(node->blockNodes.empty() || node->blockNodesState == NodeState::Grouped);

	ParserContext ct(nullptr, errorReceiver, sTable);
	unsigned expectedIndents = (node->line ? node->line->indents + 1 : 0);

	std::vector<std::shared_ptr<Node>> outNodes;
	for (auto it = node->blockNodes.cbegin(); it != node->blockNodes.cend(); ) {
		auto& n = *it;

		if (n->line->indents != expectedIndents) {
			ct.errorAtToken(ErrorLevel::Error, n->line->tokens[0],
					"indent mismatch. Expected ${0} indents but ${1} indents found",
					{std::to_string(expectedIndents), std::to_string(n->line->indents)});
			outNodes.clear();
			break;
		}

		if (n->line->tokens[0].type == TokenType::Name) {
			// Look ahead 3 tokens to find "label : loop", "def operator" or "else if" pattern
			auto itForward = it;
			size_t tokenIndex = 0;

			auto token0 = nextTokenFromNodes(it, node->blockNodes.cend(), itForward, tokenIndex);
			auto token1 = nextTokenFromNodes(it, node->blockNodes.cend(), itForward, tokenIndex);
			auto token2 = nextTokenFromNodes(it, node->blockNodes.cend(), itForward, tokenIndex);

			auto keyToken = token0;
			StringId labelName = StringId::Invalid;
			if (token2 != nullptr && !lineTypes.count(token0->sid)
					&& matches(*token1, StringId::Colon) && matches(*token2, TokenType::Name)) {
				keyToken = token2;
				labelName = token0->sid;
			}

			auto itType = lineTypes.find(keyToken->sid);
			if (itType != lineTypes.end()) {
				auto const& attr = itType->second;
				it = combineWrappedLines(it, node->blockNodes.cend(), attr.hasBlock);

				if (token2 != nullptr && labelName != StringId::Invalid) {
					if (n->tokens.size() < 3 || token2 != n->tokens[2]) {
						ct.errorAtToken(ErrorLevel::Error, *token2, "this line seems to be part of wrapping line, but indents may be incorrect", {});
						// Skip few lines which is considered as part of wrapping line
						it = (itForward == node->blockNodes.cend() || tokenIndex == 0 ? itForward : itForward + 1);
						continue;
					}
					if (attr.type != NodeType::For && attr.type != NodeType::While) {
						ct.errorAtToken(ErrorLevel::Error, *token2, R"(only "for" or "while" can take label)", {});
						continue;
					}
					n->sid = labelName;
				}

				// Check whether sentence is correctly placed
				if (std::find(attr.parentType.cbegin(), attr.parentType.cend(), node->type) == attr.parentType.cend()) {
					ct.errorAtToken(ErrorLevel::Error, *keyToken,
							std::string("statement \"") + ct.getSt()->ref(keyToken->sid) + "\" is not allowed here", {});
					continue;
				}

				n->type = attr.type;
				if (n->type == NodeType::Def && token1 != nullptr && matches(*token1, StringId::Operator))
					n->type = NodeType::DefOperator;
				if (n->type == NodeType::Else && token1 != nullptr && matches(*token1, StringId::If))
					n->type = NodeType::ElseIf;

				if (attr.hasBlock) {
					for (; it != node->blockNodes.cend() && expectedIndents < (*it)->line->indents; it++)
						n->blockNodes.push_back(*it);
				}

				outNodes.push_back(n);
				continue;
			}
		}

		it = combineWrappedLines(it, node->blockNodes.cend(), false);

		if (std::find(expressionParentType.cbegin(), expressionParentType.cend(), node->type) == expressionParentType.cend()) {
			ct.errorAtLine(ErrorLevel::Error, n->line, "expression is not allowed here", {});
			continue;
		}

		n->type = NodeType::Expression;
		outNodes.push_back(n);
	}

	// Check empty block
	if (runnableContainerNodeTypes.count(node->type) != 0) {
		bool runnableNodeFound = false;
		for (auto& n : outNodes) {
			if (runnableNodeTypes.count(n->type) != 0) {
				runnableNodeFound = true;
				break;
			}
		}
		if (!runnableNodeFound)
			ct.errorAtLine(ErrorLevel::Warning, node->line, "empty block statement", {});
	}

	// Check order of Catch/Finally and unreachable code
	bool catchFinallyFound = false;
	bool finallyFound = false;
	bool left = false;
	for (auto it = outNodes.cbegin(); it != outNodes.cend(); it++) {
		auto& n = *it;
		if (finallyFound) {
			ct.errorAtLine(ErrorLevel::Error, n->line, "nothing can be placed after \"finally\" block", {});
			outNodes.erase(it, outNodes.cend());
			break;
		}

		if (n->type == NodeType::Catch)
			catchFinallyFound = true;
		else if (n->type == NodeType::Finally) {
			catchFinallyFound = true;
			finallyFound = true;
		}
		else {
			if (left) {
				ct.errorAtLine(ErrorLevel::Warning, n->line, "unreachable code", {});
				it = outNodes.erase(it, std::find_if(it, outNodes.cend(), [](const std::shared_ptr<Node>& n) {
					return n->type == NodeType::Catch || n->type == NodeType::Finally; }));
				if (it == outNodes.cend())
					break;
				it--;
				continue;
			}

			switch (n->type) {
			case NodeType::Break:
			case NodeType::Continue:
			case NodeType::Return:
			case NodeType::Throw:
				left = true;
				break;
			default:
				break;
			}

			if (catchFinallyFound) {
				ct.errorAtLine(ErrorLevel::Error, n->line, R"(expected "catch" or "finally")", {});
				outNodes.erase(it, outNodes.cend());
				break;
			}
		}
	}

	// Check order of Case/Default
	if (node->type == NodeType::Switch) {
		bool defaultFound = false;
		for (auto it = outNodes.cbegin(); it != outNodes.cend(); it++) {
			auto& n = *it;
			if (n->type == NodeType::Default)
				defaultFound = true;
			else if (n->type == NodeType::Case && defaultFound) {
				ct.errorAtLine(ErrorLevel::Error, n->line, R"("case" cannot be placed after "default")", {});
				outNodes.erase(it, outNodes.cend());
				break;
			}
		}
	}

	// Copy outNodes to node->blockNodes with grouping IfGroup
	node->blockNodes.clear();
	for (auto& n : outNodes) {
		switch (n->type) {
		case NodeType::Sync:
			if (!recursive)
				structureInnerNode(errorReceiver, sTable, n.get(), false);
			node->blockNodes.push_back(n);
			break;

		case NodeType::If: {
			auto& nGroup = addNode(node->blockNodes, nullptr, NodeType::IfGroup);
			nGroup->blockNodes.push_back(n);
			nGroup->blockNodesState = NodeState::Structured;
			break;
		}

		case NodeType::ElseIf:
		case NodeType::Else: {
			if (node->blockNodes.empty() || node->blockNodes.back()->type != NodeType::IfGroup) {
				ct.errorAtLine(ErrorLevel::Error, n->line, R"(unexpected "else" statement)", {});
				continue;
			}
			auto& nGroup = node->blockNodes.back();
			if (nGroup->blockNodes.back()->type == NodeType::Else) {
				ct.errorAtLine(ErrorLevel::Error, n->line, R"(extra "else" statement)", {});
				continue;
			}
			nGroup->blockNodes.push_back(n);
			break;
		}

		default:
			node->blockNodes.push_back(n);
			break;
		}
	}

	if (recursive) {
		for (auto& n : node->blockNodes)
			recursiveStructureNodes(errorReceiver, sTable, n.get());
	}

	node->blockNodesState = NodeState::Structured;
}